

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevelFileReader.cpp
# Opt level: O2

string * __thiscall
LevelFileReader::GetWord_abi_cxx11_(string *__return_storage_ptr__,LevelFileReader *this)

{
  allocator local_11;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_1dbd + 0x12,&local_11);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)this->fileStream,(string *)__return_storage_ptr__,'\n');
  return __return_storage_ptr__;
}

Assistant:

std::string LevelFileReader::GetWord()
{
  std::string word = "";
  getline(fileStream, word, '\n');
  return word;
}